

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O1

void __thiscall
InstructionVMEvalContext::StackFrame::AssignRegister(StackFrame *this,uint id,VmConstant *constant)

{
  uint newSize;
  SmallArray<VmConstant_*,_32U> *this_00;
  uint uVar1;
  
  if (id == 0) {
    __assert_fail("id != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                  ,0x80,
                  "void InstructionVMEvalContext::StackFrame::AssignRegister(unsigned int, VmConstant *)"
                 );
  }
  this_00 = &this->instructionValues;
  uVar1 = (this->instructionValues).count;
  if (uVar1 < id) {
    newSize = id + 0x20;
    if ((this->instructionValues).max <= newSize) {
      SmallArray<VmConstant_*,_32U>::grow(this_00,newSize);
    }
    (this->instructionValues).count = newSize;
    if (newSize <= uVar1) goto LAB_00295900;
    memset(this_00->data + uVar1,0,(ulong)(newSize - uVar1) << 3);
  }
  if (id - 1 < (this->instructionValues).count) {
    this_00->data[id - 1] = constant;
    return;
  }
LAB_00295900:
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x199,
                "T &SmallArray<VmConstant *, 32>::operator[](unsigned int) [T = VmConstant *, N = 32]"
               );
}

Assistant:

void InstructionVMEvalContext::StackFrame::AssignRegister(unsigned id, VmConstant *constant)
{
	assert(id != 0);

	unsigned oldSize = instructionValues.size();
	unsigned newSize = id;

	if(newSize > oldSize)
	{
		instructionValues.resize(newSize + 32);

		memset(&instructionValues[oldSize], 0, (instructionValues.size() - oldSize) * sizeof(instructionValues[0]));
	}

	instructionValues[id - 1] = constant;
}